

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::TopKLayerParams::MergePartialFromCodedStream
          (TopKLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  int iVar8;
  char cVar9;
  ulong uVar10;
  int iVar11;
  pair<unsigned_long,_bool> pVar12;
  pair<unsigned_long,_bool> pVar13;
  
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003bee90;
      input->buffer_ = pbVar3 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003bee90:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar10 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar6 | uVar10;
    }
    uVar6 = (uint32)uVar10;
    iVar11 = 6;
    iVar8 = iVar11;
    if ((uVar10 & 0x100000000) == 0) {
LAB_003beeb1:
      iVar8 = 7;
      if (((uVar6 & 7) != 4 && uVar6 != 0) &&
         (bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6), iVar8 = iVar11
         , bVar5)) {
LAB_003beed6:
        iVar8 = 0;
      }
    }
    else {
      uVar7 = (uint)(uVar10 >> 3) & 0x1fffffff;
      cVar9 = (char)uVar10;
      if (uVar7 != 3) {
        if (uVar7 == 2) {
          if (cVar9 != '\x10') goto LAB_003beeb1;
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (-1 < (long)(char)*puVar4)) {
            this->k_ = (long)(char)*puVar4;
            input->buffer_ = puVar4 + 1;
          }
          else {
            pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            this->k_ = pVar13.first;
            if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
            goto LAB_003beed8;
          }
        }
        else {
          if ((uVar7 != 1) || (cVar9 != '\b')) goto LAB_003beeb1;
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
            input->buffer_ = puVar4 + 1;
            pVar13._8_8_ = 1;
            pVar13.first = (long)(char)uVar2;
          }
          else {
            pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          }
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_003beed8;
          this->axis_ = pVar13.first;
        }
        goto LAB_003beed6;
      }
      if (cVar9 != '\x18') goto LAB_003beeb1;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
        input->buffer_ = puVar4 + 1;
        pVar12._8_8_ = 1;
        pVar12.first = (long)(char)uVar2;
      }
      else {
        pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      }
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->usebottomk_ = pVar12.first != 0;
        goto LAB_003beed6;
      }
    }
LAB_003beed8:
    if (iVar8 != 0) {
      return iVar8 != 6;
    }
  } while( true );
}

Assistant:

bool TopKLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.TopKLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 axis = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 K = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &k_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool useBottomK = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &usebottomk_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.TopKLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.TopKLayerParams)
  return false;
#undef DO_
}